

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::Miner::setJob(Miner *this,Job *job)

{
  bool bVar1;
  reference ppIVar2;
  char *pcVar3;
  int __c;
  Job *in_RSI;
  IBackend ***__s;
  long in_RDI;
  uint8_t index;
  IBackend *backend;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range1;
  Job *in_stack_ffffffffffffffa8;
  Job *in_stack_ffffffffffffffb0;
  bool local_41;
  MinerPrivate *in_stack_ffffffffffffffd0;
  IBackend **local_28;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_20;
  long local_18;
  Job *local_10;
  
  local_18 = *(long *)(in_RDI + 0x18) + 0x120;
  local_10 = in_RSI;
  local_20._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
                  in_stack_ffffffffffffffa8);
  local_28 = (IBackend **)
             std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end
                       ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
                        in_stack_ffffffffffffffa8);
  while( true ) {
    __s = &local_28;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = (MinerPrivate *)*ppIVar2;
    (*(*(_func_int ***)in_stack_ffffffffffffffd0)[7])(in_stack_ffffffffffffffd0,local_10);
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_20);
  }
  std::mutex::lock((mutex *)in_stack_ffffffffffffffb0);
  pcVar3 = Job::index((Job *)(*(long *)(in_RDI + 0x18) + 0x10),(char *)__s,__c);
  local_41 = false;
  if (((uint)pcVar3 & 0xff) == 1) {
    in_stack_ffffffffffffffb0 = (Job *)(*(long *)(in_RDI + 0x18) + 0x138);
    Job::id(local_10);
    local_41 = String::operator==((String *)in_stack_ffffffffffffffb0,
                                  (String *)in_stack_ffffffffffffffa8);
  }
  *(byte *)(*(long *)(in_RDI + 0x18) + 2) = (local_41 ^ 0xffU) & 1;
  Job::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Job::setIndex((Job *)(*(long *)(in_RDI + 0x18) + 0x10),'\0');
  Job::id(local_10);
  String::operator=((String *)in_stack_ffffffffffffffb0,(String *)in_stack_ffffffffffffffa8);
  std::mutex::unlock((mutex *)0x2304d2);
  MinerPrivate::handleJobChange(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void xmrig::Miner::setJob(const Job &job)
{
    for (IBackend *backend : d_ptr->backends) {
        backend->prepare(job);
    }

    mutex.lock();

    const uint8_t index = 0;

    d_ptr->reset = !(d_ptr->job.index() == 1 && index == 0 && d_ptr->userJobId == job.id());
    d_ptr->job   = job;
    d_ptr->job.setIndex(index);

    if (index == 0) {
        d_ptr->userJobId = job.id();
    }

    mutex.unlock();
    d_ptr->handleJobChange();
}